

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int selectWindowRewriteSelectCb(Walker *pWalker,Select *pSelect)

{
  Walker *pWVar1;
  Walker *in_RSI;
  long in_RDI;
  Select *pSave;
  WindowRewrite *p;
  Select *p_00;
  uint local_4;
  
  p_00 = *(Select **)(in_RDI + 0x28);
  pWVar1 = (Walker *)p_00->pEList;
  if (pWVar1 != in_RSI) {
    p_00->pEList = (ExprList *)in_RSI;
    sqlite3WalkSelect(in_RSI,p_00);
    p_00->pEList = (ExprList *)pWVar1;
  }
  local_4 = (uint)(pWVar1 != in_RSI);
  return local_4;
}

Assistant:

static int selectWindowRewriteSelectCb(Walker *pWalker, Select *pSelect){
  struct WindowRewrite *p = pWalker->u.pRewrite;
  Select *pSave = p->pSubSelect;
  if( pSave==pSelect ){
    return WRC_Continue;
  }else{
    p->pSubSelect = pSelect;
    sqlite3WalkSelect(pWalker, pSelect);
    p->pSubSelect = pSave;
  }
  return WRC_Prune;
}